

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall
md::Code::movem(Code *this,vector<md::DataRegister,_std::allocator<md::DataRegister>_> *data_regs,
               vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *addr_regs,
               bool direction_storage,AddressRegister *destination,Size size)

{
  pointer pDVar1;
  pointer pAVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  short sVar7;
  undefined7 in_register_00000009;
  uint16_t word;
  uint uVar8;
  const_iterator __begin2;
  pointer pDVar9;
  pointer pAVar10;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *__range2;
  
  iVar4 = (**(destination->super_Register).super_Param._vptr_Param)(destination);
  pDVar9 = (data_regs->super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (data_regs->super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  if ((int)CONCAT71(in_register_00000009,direction_storage) == 0) {
    for (; pDVar9 != pDVar1; pDVar9 = pDVar9 + 1) {
      uVar6 = (**(pDVar9->super_Register).super_Param._vptr_Param)(pDVar9);
      uVar8 = uVar8 | 1 << (uVar6 & 0x1f);
    }
    pAVar2 = (addr_regs->
             super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pAVar10 = (addr_regs->
                   super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>).
                   _M_impl.super__Vector_impl_data._M_start; word = (uint16_t)uVar8,
        pAVar10 != pAVar2; pAVar10 = pAVar10 + 1) {
      iVar5 = (**(pAVar10->super_Register).super_Param._vptr_Param)(pAVar10);
      uVar8 = uVar8 | 0x100 << ((byte)iVar5 & 0x1f);
    }
    sVar7 = 0x18;
    uVar3 = 0x4c80;
  }
  else {
    for (; pDVar9 != pDVar1; pDVar9 = pDVar9 + 1) {
      iVar5 = (**(pDVar9->super_Register).super_Param._vptr_Param)(pDVar9);
      uVar8 = uVar8 | 0x8000U >> ((byte)iVar5 & 0x1f);
    }
    pAVar2 = (addr_regs->
             super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pAVar10 = (addr_regs->
                   super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>).
                   _M_impl.super__Vector_impl_data._M_start; word = (uint16_t)uVar8,
        pAVar10 != pAVar2; pAVar10 = pAVar10 + 1) {
      iVar5 = (**(pAVar10->super_Register).super_Param._vptr_Param)(pAVar10);
      uVar8 = uVar8 | 0x80U >> ((byte)iVar5 & 0x1f);
    }
    sVar7 = 0x20;
    uVar3 = 0x4880;
  }
  add_word(this,(sVar7 + (short)iVar4 & 0xffU) + (uVar3 | (ushort)(size == LONG) << 6));
  add_word(this,word);
  return this;
}

Assistant:

Code& Code::movem(const std::vector<DataRegister>& data_regs, const std::vector<AddressRegister>& addr_regs, bool direction_storage, const AddressRegister& destination, md::Size size)
{
    uint8_t size_bit = (size == md::Size::LONG) ? 1 : 0;
    uint8_t direction_bit = (direction_storage) ? 0 : 1;

    uint8_t dest_m = (direction_storage) ? 0x4 : 0x3;
    uint8_t dest_xn = destination.getXn();
    uint8_t dest_mxn = (dest_m << 3) + dest_xn;

    uint16_t registersToStore = 0x0000;
    if(direction_storage)
    {
        for(const DataRegister& r : data_regs)
            registersToStore |= (0x8000 >> r.getXn());
        for(const AddressRegister& r : addr_regs)
            registersToStore |= (0x0080 >> r.getXn());
    }
    else
    {
        for (const DataRegister& r : data_regs)
            registersToStore |= (0x0001 << r.getXn());
        for (const AddressRegister& r : addr_regs)
            registersToStore |= (0x0100 << r.getXn());
    }

    uint16_t opcode = 0x4880 + (direction_bit << 10) + (size_bit << 6) + dest_mxn;

    this->add_opcode(opcode);
    this->add_word(registersToStore); // 0xFFFE = D0-D7 and A0-A6
    return *this;
}